

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::resize
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,int m)

{
  int iVar1;
  KeyVal *this_00;
  Dic<asl::String> *this_01;
  long lVar2;
  
  iVar1 = *(int *)((long)&this->_a[-1].key.field_2 + 8);
  lVar2 = (long)iVar1;
  reserve(this,m);
  if (iVar1 < m) {
    this_00 = this->_a + lVar2;
    lVar2 = (long)m * 0x20 + lVar2 * -0x20;
    do {
      Map<asl::String,_asl::Dic<asl::String>_>::KeyVal::KeyVal(this_00);
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != 0);
  }
  else if (m < iVar1) {
    lVar2 = lVar2 * 0x20 + (long)m * -0x20;
    this_01 = &this->_a[m].value;
    do {
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array
                ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)this_01);
      if ((((KeyVal *)(this_01 + -3))->key)._size != 0) {
        ::free(((anon_union_16_2_78e7fdac_for_String_2 *)(this_01 + -2))->_str);
      }
      this_01 = this_01 + 4;
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != 0);
  }
  *(int *)((long)&this->_a[-1].key.field_2 + 8) = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}